

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

void __thiscall TaprootSpendData::Merge(TaprootSpendData *this,TaprootSpendData other)

{
  uint256 *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  _Rb_tree_node_base *p_Var7;
  undefined8 *in_RSI;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *this_01;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = &this->merkle_root;
  puVar6 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (this,puVar1);
  if (((uint256 *)puVar6 == puVar1) &&
     (puVar6 = std::
               __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                         (), puVar6 != (uchar *)(in_RSI + 4))) {
    uVar3 = *in_RSI;
    uVar4 = in_RSI[1];
    uVar5 = in_RSI[3];
    *(undefined8 *)((this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
         in_RSI[2];
    *(undefined8 *)((this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uVar5;
    *(undefined8 *)(this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems = uVar3;
    *(undefined8 *)((this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
         uVar4;
  }
  this_01 = &this->scripts;
  puVar6 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (puVar1,this_01);
  if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
       *)puVar6 == this_01) {
    puVar6 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (in_RSI + 4,in_RSI + 8);
    if (puVar6 != (uchar *)(in_RSI + 8)) {
      uVar3 = in_RSI[4];
      uVar4 = in_RSI[5];
      uVar5 = in_RSI[7];
      *(undefined8 *)((this->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) = in_RSI[6];
      *(undefined8 *)((this->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
      *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems = uVar3;
      *(undefined8 *)((this->merkle_root).super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
    }
  }
  for (p_Var7 = (_Rb_tree_node_base *)in_RSI[0xb]; p_Var7 != (_Rb_tree_node_base *)(in_RSI + 9);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    this_00 = &std::
               map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
               ::operator[](this_01,(key_type *)(p_Var7 + 1))->_M_t;
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_M_merge_unique<ShortestVectorFirstComparator>
              (this_00,(_Compatible_tree<ShortestVectorFirstComparator> *)(p_Var7 + 2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TaprootSpendData::Merge(TaprootSpendData other)
{
    // TODO: figure out how to better deal with conflicting information
    // being merged.
    if (internal_key.IsNull() && !other.internal_key.IsNull()) {
        internal_key = other.internal_key;
    }
    if (merkle_root.IsNull() && !other.merkle_root.IsNull()) {
        merkle_root = other.merkle_root;
    }
    for (auto& [key, control_blocks] : other.scripts) {
        scripts[key].merge(std::move(control_blocks));
    }
}